

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcDetect.c
# Opt level: O2

Vec_Int_t *
Abc_NtkFinCheckPair(Abc_Ntk_t *pNtk,Vec_Int_t *vTypes,Vec_Int_t *vCos,Vec_Int_t *vCis,
                   Vec_Int_t *vNodes,int *iObjs,int *Types,Vec_Int_t *vLits)

{
  int iVar1;
  int iVar2;
  int iVar3;
  Gia_Man_t *p;
  Gia_Obj_t *pGVar4;
  Cnf_Dat_t *p_00;
  sat_solver *s;
  Vec_Int_t *pVVar5;
  long lVar6;
  int iVar7;
  uint uVar8;
  
  p = Abc_NtkFinMiterToGia(pNtk,vTypes,vCos,vCis,vNodes,iObjs,Types,vLits);
  iVar7 = (int)vTypes;
  if ((p->nObjs == p->vCis->nSize + p->vCos->nSize + 1) &&
     (pGVar4 = Gia_ManCo(p,iVar7),
     (~*(ulong *)(pGVar4 + -(ulong)((uint)*(undefined8 *)pGVar4 & 0x1fffffff)) & 0x1fffffff1fffffff)
     == 0)) {
    pGVar4 = Gia_ManCo(p,iVar7);
    if ((pGVar4->field_0x3 & 0x20) == 0) {
      pVVar5 = (Vec_Int_t *)0x0;
    }
    else {
      pVVar5 = Vec_IntStart(vCis->nSize);
    }
    Gia_ManStop(p);
    return pVVar5;
  }
  p_00 = (Cnf_Dat_t *)Mf_ManGenerateCnf(p,8,0,1,0,0);
  s = (sat_solver *)Cnf_DataWriteIntoSolver(p_00,1,0);
  if (s == (sat_solver *)0x0) {
    Gia_ManStop(p);
    Cnf_DataFree(p_00);
    pVVar5 = (Vec_Int_t *)0x0;
  }
  else {
    iVar7 = p_00->nVars;
    iVar1 = p->vCis->nSize;
    iVar2 = p->nRegs;
    Gia_ManStop(p);
    Cnf_DataFree(p_00);
    pVVar5 = (Vec_Int_t *)0x0;
    iVar3 = sat_solver_solve(s,(lit *)0x0,(lit *)0x0,10000,0,0,0);
    if (iVar3 == 1) {
      pVVar5 = Vec_IntAlloc(vCis->nSize);
      uVar8 = (iVar7 - iVar1) + iVar2;
      for (lVar6 = 0; lVar6 < vCis->nSize; lVar6 = lVar6 + 1) {
        if (((int)uVar8 < 0) || (s->size <= (int)lVar6 + ((iVar2 + iVar7) - iVar1))) {
          __assert_fail("v >= 0 && v < s->size",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bsat/satSolver.h"
                        ,0xda,"int sat_solver_var_value(sat_solver *, int)");
        }
        Vec_IntPush(pVVar5,(uint)(s->model[(ulong)uVar8 + lVar6] == 1));
      }
    }
    else if (iVar3 == 0) {
      pVVar5 = Vec_IntAlloc(0);
    }
    sat_solver_delete(s);
  }
  return pVVar5;
}

Assistant:

Vec_Int_t * Abc_NtkFinCheckPair( Abc_Ntk_t * pNtk, Vec_Int_t * vTypes, Vec_Int_t * vCos, Vec_Int_t * vCis, Vec_Int_t * vNodes, int iObjs[2], int Types[2], Vec_Int_t * vLits )
{
    Gia_Man_t * pGia = Abc_NtkFinMiterToGia( pNtk, vTypes, vCos, vCis, vNodes, iObjs, Types, vLits );
    if ( Gia_ManAndNum(pGia) == 0 && Gia_ObjIsConst0(Gia_ObjFanin0(Gia_ManCo(pGia, 0))) )
    {
        Vec_Int_t * vPat = Gia_ObjFaninC0(Gia_ManCo(pGia, 0)) ? Vec_IntStart(Vec_IntSize(vCis)) : NULL;
        Gia_ManStop( pGia );
        return vPat;
    }
    else
    {
        Cnf_Dat_t * pCnf = (Cnf_Dat_t *)Mf_ManGenerateCnf( pGia, 8, 0, 1, 0, 0 );
        sat_solver * pSat = (sat_solver *)Cnf_DataWriteIntoSolver( pCnf, 1, 0 );
        if ( pSat == NULL )
        {
            Gia_ManStop( pGia );
            Cnf_DataFree( pCnf );
            return NULL;
        }
        else
        {
            int i, nConfLimit = 10000;
            Vec_Int_t * vPat = NULL;
            int status, iVarBeg = pCnf->nVars - Gia_ManPiNum(pGia);// - 1;
            //Gia_AigerWrite( pGia, "temp_detect.aig", 0, 0, 0 );
            Gia_ManStop( pGia );
            Cnf_DataFree( pCnf );
            status = sat_solver_solve( pSat, NULL, NULL, (ABC_INT64_T)nConfLimit, 0, 0, 0 );
            if ( status == l_Undef )
                vPat = Vec_IntAlloc(0);
            else if ( status == l_True )
            {
                vPat = Vec_IntAlloc( Vec_IntSize(vCis) );
                for ( i = 0; i < Vec_IntSize(vCis); i++ )
                    Vec_IntPush( vPat, sat_solver_var_value(pSat, iVarBeg+i) );
            }
            //printf( "%d ", sat_solver_nconflicts(pSat) );
            sat_solver_delete( pSat );
            return vPat;
        }
    }
}